

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O1

void __thiscall TCLAP::StdOutput::failure(StdOutput *this,CmdLineInterface *_cmd,ArgException *e)

{
  long lVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 *puVar5;
  string progName;
  long *local_90;
  long local_88;
  long local_80 [2];
  string local_70;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  iVar3 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  local_50 = local_40;
  lVar1 = *(long *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar1,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"PARSE ERROR: ",0xd);
  ArgException::argId_abi_cxx11_(&local_70,e);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"             ",0xd);
  pcVar2 = (e->_errorText)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (e->_errorText)._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_90,local_88);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xf])(_cmd);
  if ((char)iVar3 == '\0') {
    (*(this->super_CmdLineOutput)._vptr_CmdLineOutput[2])(this,_cmd);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Brief USAGE: ",0xd);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    _shortUsage(this,_cmd,(ostream *)&std::cerr);
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"For complete USAGE and HELP type: ",0x22);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"   ",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," --help",7);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 1;
  __cxa_throw(puVar5,&ExitException::typeinfo,0);
}

Assistant:

inline void StdOutput::failure( CmdLineInterface& _cmd,
								ArgException& e ) 
{
	std::string progName = _cmd.getProgramName();

	std::cerr << "PARSE ERROR: " << e.argId() << std::endl
		      << "             " << e.error() << std::endl << std::endl;

	if ( _cmd.hasHelpAndVersion() )
		{
			std::cerr << "Brief USAGE: " << std::endl;

			_shortUsage( _cmd, std::cerr );	

			std::cerr << std::endl << "For complete USAGE and HELP type: " 
					  << std::endl << "   " << progName << " --help" 
					  << std::endl << std::endl;
		}
	else
		usage(_cmd);

	throw ExitException(1);
}